

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraceCalls.cpp
# Opt level: O2

void __thiscall wasm::AddTraceWrappers::~AddTraceWrappers(AddTraceWrappers *this)

{
  ~AddTraceWrappers(this);
  operator_delete(this,0x160);
  return;
}

Assistant:

AddTraceWrappers(TracedFunctions tracedFunctions)
    : tracedFunctions(std::move(tracedFunctions)) {}